

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_common.hpp
# Opt level: O2

void __thiscall
afsm::test::state_name::
on_exit<afsm::test::events::terminate_const&,afsm::state_machine<afsm::test::connection_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>>
          (state_name *this,terminate *param_1,
          state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
          *param_2)

{
  long lVar1;
  ostream *poVar2;
  string asStack_38 [32];
  
  poVar2 = psst::operator<<((ostream *)&std::cerr,cyan|dim);
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x11;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x20;
  poVar2 = std::operator<<(poVar2,(string *)events::terminate::name_abi_cxx11_);
  poVar2 = psst::operator<<(poVar2,clear);
  poVar2 = std::operator<<(poVar2,": Exit ");
  (*this->_vptr_state_name[2])(asStack_38,this);
  poVar2 = std::operator<<(poVar2,asStack_38);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string(asStack_38);
  return;
}

Assistant:

void
    on_exit(Event&&, FSM&)
    {
        using decayed_event = typename ::std::decay<Event>::type;
        using ::psst::ansi_color;
        ::std::cerr
             << (ansi_color::cyan | ansi_color::dim)
             << ::std::setw(event_name_width) << ::std::left
             << decayed_event::name << ansi_color::clear
             << ": Exit " << name() << "\n";
    }